

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OSSLECPublicKey.cpp
# Opt level: O3

unsigned_long __thiscall OSSLECPublicKey::getOrderLength(OSSLECPublicKey *this)

{
  int iVar1;
  int iVar2;
  EC_GROUP *group;
  BIGNUM *order;
  unsigned_long uVar3;
  
  group = EC_KEY_get0_group((EC_KEY *)this->eckey);
  if ((group != (EC_GROUP *)0x0) && (order = BN_new(), order != (BIGNUM *)0x0)) {
    uVar3 = 0;
    iVar1 = EC_GROUP_get_order(group,order,(BN_CTX *)0x0);
    if (iVar1 != 0) {
      iVar2 = BN_num_bits(order);
      iVar1 = iVar2 + 0xe;
      if (-1 < iVar2 + 7) {
        iVar1 = iVar2 + 7;
      }
      uVar3 = (unsigned_long)(iVar1 >> 3);
    }
    BN_clear_free(order);
    return uVar3;
  }
  return 0;
}

Assistant:

unsigned long OSSLECPublicKey::getOrderLength() const
{
	const EC_GROUP* grp = EC_KEY_get0_group(eckey);
	if (grp != NULL)
	{
		BIGNUM* order = BN_new();
		if (order == NULL)
			return 0;
		if (!EC_GROUP_get_order(grp, order, NULL))
		{
			BN_clear_free(order);
			return 0;
		}
		unsigned long len = BN_num_bytes(order);
		BN_clear_free(order);
		return len;
	}
	return 0;
}